

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

void google::protobuf::internal::ExtensionSet::RegisterEnumExtension
               (MessageLite *containing_type,int number,FieldType type,bool is_repeated,
               bool is_packed,EnumValidityFunc *is_valid)

{
  ExtensionInfo info;
  LogMessage *other;
  undefined7 in_register_00000011;
  LogMessage local_90;
  FieldType local_58;
  undefined1 uStack_57;
  undefined1 uStack_56;
  undefined5 uStack_55;
  code *pcStack_50;
  EnumValidityFunc *local_48;
  undefined8 uStack_40;
  int local_38;
  LogFinisher local_31;
  
  if ((int)CONCAT71(in_register_00000011,type) != 0xe) {
    local_38 = number;
    LogMessage::LogMessage
              (&local_90,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/extension_set.cc"
               ,0xa4);
    other = LogMessage::operator<<
                      (&local_90,"CHECK failed: (type) == (WireFormatLite::TYPE_ENUM): ");
    LogFinisher::operator=(&local_31,other);
    LogMessage::~LogMessage(&local_90);
    number = local_38;
  }
  pcStack_50 = CallNoArgValidityFunc;
  uStack_40 = 0;
  info.is_repeated = is_repeated;
  info.type = type;
  info.is_packed = is_packed;
  info._3_5_ = uStack_55;
  info.field_3.enum_validity_check.func = CallNoArgValidityFunc;
  info.field_3.enum_validity_check.arg = is_valid;
  info.descriptor = (FieldDescriptor *)0x0;
  local_58 = type;
  uStack_57 = is_repeated;
  uStack_56 = is_packed;
  local_48 = is_valid;
  anon_unknown_22::Register(containing_type,number,info);
  return;
}

Assistant:

void ExtensionSet::RegisterEnumExtension(const MessageLite* containing_type,
                                         int number, FieldType type,
                                         bool is_repeated, bool is_packed,
                                         EnumValidityFunc* is_valid) {
  GOOGLE_CHECK_EQ(type, WireFormatLite::TYPE_ENUM);
  ExtensionInfo info(type, is_repeated, is_packed);
  info.enum_validity_check.func = CallNoArgValidityFunc;
  // See comment in CallNoArgValidityFunc() about why we use a c-style cast.
  info.enum_validity_check.arg = (void*)is_valid;
  Register(containing_type, number, info);
}